

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

Error __thiscall
asmjit::ZoneVectorBase::_grow(ZoneVectorBase *this,ZoneHeap *heap,size_t sizeOfT,size_t n)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  long in_RCX;
  ulong in_RDX;
  long in_RDI;
  size_t unaff_retaddr;
  size_t after;
  size_t capacity;
  size_t threshold;
  undefined8 local_38;
  undefined4 in_stack_fffffffffffffff8;
  Error EVar4;
  undefined4 in_stack_fffffffffffffffc;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RDX;
  uVar2 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x800000)) / auVar1,0);
  local_38 = *(ulong *)(in_RDI + 0x10);
  if (-in_RCX - 1U < *(ulong *)(in_RDI + 8)) {
    EVar4 = 1;
  }
  else {
    uVar3 = in_RCX + *(ulong *)(in_RDI + 8);
    if (local_38 < uVar3) {
      if (local_38 < 4) {
        local_38 = 4;
      }
      else if (local_38 < 8) {
        local_38 = 8;
      }
      else if (local_38 < 0x10) {
        local_38 = 0x10;
      }
      else if (local_38 < 0x40) {
        local_38 = 0x40;
      }
      else if (local_38 < 0x100) {
        local_38 = 0x100;
      }
      while (local_38 < uVar3) {
        if (local_38 < uVar2) {
          local_38 = local_38 << 1;
        }
        else {
          local_38 = uVar2 + local_38;
        }
      }
      EVar4 = _reserve((ZoneVectorBase *)capacity,(ZoneHeap *)after,unaff_retaddr,
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    }
    else {
      EVar4 = 0;
    }
  }
  return EVar4;
}

Assistant:

Error ZoneVectorBase::_grow(ZoneHeap* heap, size_t sizeOfT, size_t n) noexcept {
  size_t threshold = Globals::kAllocThreshold / sizeOfT;
  size_t capacity = _capacity;
  size_t after = _length;

  if (ASMJIT_UNLIKELY(IntTraits<size_t>::maxValue() - n < after))
    return DebugUtils::errored(kErrorNoHeapMemory);

  after += n;
  if (capacity >= after)
    return kErrorOk;

  // ZoneVector is used as an array to hold short-lived data structures used
  // during code generation. The growing strategy is simple - use small capacity
  // at the beginning (very good for ZoneHeap) and then grow quicker to prevent
  // successive reallocations.
  if (capacity < 4)
    capacity = 4;
  else if (capacity < 8)
    capacity = 8;
  else if (capacity < 16)
    capacity = 16;
  else if (capacity < 64)
    capacity = 64;
  else if (capacity < 256)
    capacity = 256;

  while (capacity < after) {
    if (capacity < threshold)
      capacity *= 2;
    else
      capacity += threshold;
  }

  return _reserve(heap, sizeOfT, capacity);
}